

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O0

int IssueCommandRoboteq(ROBOTEQ *pRoboteq,char *commandType,char *command,char *args,int waitms,
                       char *response,BOOL bPlusMinus)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint local_1174;
  char *pcStack_1170;
  int respstrlen;
  char *resp;
  char tmp [256];
  undefined4 local_105c;
  uint8 local_1058 [4];
  int recvbuflen;
  char recvbuf [2048];
  uint8 local_848 [4];
  int sendbuflen;
  char sendbuf [2048];
  char *response_local;
  int waitms_local;
  char *args_local;
  char *command_local;
  char *commandType_local;
  ROBOTEQ *pRoboteq_local;
  
  local_105c = 0;
  pcStack_1170 = (char *)0x0;
  local_1174 = 0;
  memset(local_848,0,0x800);
  sVar2 = strlen(args);
  if (sVar2 == 0) {
    sprintf((char *)local_848,"%.255s%.255s\r",commandType,command);
  }
  else {
    sprintf((char *)local_848,"%.255s%.255s %.255s\r",commandType,command,args);
  }
  sVar2 = strlen((char *)local_848);
  iVar1 = WriteAllRS232Port(&pRoboteq->RS232Port,local_848,(int)sVar2);
  if (iVar1 == 0) {
    if ((pRoboteq->bSaveRawData != 0) && (pRoboteq->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_848,(long)(int)sVar2,1,(FILE *)pRoboteq->pfSaveFile);
      fflush((FILE *)pRoboteq->pfSaveFile);
    }
    mSleep((long)waitms);
    if (pRoboteq->bEcho != 0) {
      memset(local_1058,0,0x800);
      local_105c = 0x7ff;
      iVar1 = ReadUntilRS232Port(&pRoboteq->RS232Port,local_1058,'\r',0x7ff);
      if (iVar1 != 0) {
        return 1;
      }
      if ((pRoboteq->bSaveRawData != 0) && (pRoboteq->pfSaveFile != (FILE *)0x0)) {
        sVar2 = strlen((char *)local_1058);
        fwrite(local_1058,sVar2,1,(FILE *)pRoboteq->pfSaveFile);
        fflush((FILE *)pRoboteq->pfSaveFile);
      }
    }
    memset(local_1058,0,0x800);
    local_105c = 0x7ff;
    iVar1 = ReadUntilRS232Port(&pRoboteq->RS232Port,local_1058,'\r',0x7ff);
    if (iVar1 == 0) {
      if ((pRoboteq->bSaveRawData != 0) && (pRoboteq->pfSaveFile != (FILE *)0x0)) {
        sVar2 = strlen((char *)local_1058);
        fwrite(local_1058,sVar2,1,(FILE *)pRoboteq->pfSaveFile);
        fflush((FILE *)pRoboteq->pfSaveFile);
      }
      if (bPlusMinus == 0) {
        sprintf((char *)&resp,"%.254s=",command);
        pcVar3 = rstristrbeginend((char *)local_1058,(char *)&resp,"\r",&stack0xffffffffffffee90,
                                  (int *)&local_1174);
        if (pcVar3 == (char *)0x0) {
          printf("Error reading data from a Roboteq. \n");
          pRoboteq_local._4_4_ = 1;
        }
        else {
          sprintf(response,"%.*s",(ulong)local_1174,pcStack_1170);
          pRoboteq_local._4_4_ = 0;
        }
      }
      else {
        sVar2 = strlen((char *)local_1058);
        if (sVar2 < 2) {
          printf("Error reading data from a Roboteq. \n");
          pRoboteq_local._4_4_ = 1;
        }
        else {
          sVar2 = strlen((char *)local_1058);
          sprintf(response,"%c",(ulong)(uint)(int)(char)local_1058[sVar2 - 2]);
          pRoboteq_local._4_4_ = 0;
        }
      }
    }
    else {
      pRoboteq_local._4_4_ = 1;
    }
  }
  else {
    pRoboteq_local._4_4_ = 1;
  }
  return pRoboteq_local._4_4_;
}

Assistant:

inline int IssueCommandRoboteq(ROBOTEQ* pRoboteq, char* commandType, char* command, char* args, int waitms, char* response, BOOL bPlusMinus)
{
	char sendbuf[MAX_NB_BYTES_ROBOTEQ];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int recvbuflen = 0;
	char tmp[256];
	char* resp = NULL;
	int respstrlen = 0;
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (strlen(args) <= 0) sprintf(sendbuf, "%.255s%.255s\r", commandType, command);
	else sprintf(sendbuf, "%.255s%.255s %.255s\r", commandType, command, args);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pRoboteq->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	mSleep(waitms);
	
	if (pRoboteq->bEcho)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

		if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
		{
			fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
			fflush(pRoboteq->pfSaveFile);
		}
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

	if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	// Check for "+\r" or "-\r".
	if (bPlusMinus)
	{
		if (strlen(recvbuf) < 2)
		{
			printf("Error reading data from a Roboteq. \n");
			return EXIT_FAILURE;
		}
		sprintf(response, "%c", recvbuf[strlen(recvbuf)-2]);
		return EXIT_SUCCESS;
	}
	
	sprintf(tmp, "%.254s=", command);
	if (!rstristrbeginend(recvbuf, tmp, "\r", &resp, &respstrlen))
	{
		printf("Error reading data from a Roboteq. \n");
		return EXIT_FAILURE;
	}
	sprintf(response, "%.*s", respstrlen, resp);

	return EXIT_SUCCESS;
}